

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

Int __thiscall
ipx::LpSolver::LoadIPMStartingPoint
          (LpSolver *this,double *x,double *xl,double *xu,double *slack,double *y,double *zl,
          double *zu)

{
  long in_RDI;
  LpSolver *in_stack_00000010;
  Int errflag;
  Int n;
  Int m;
  double *in_stack_00000120;
  double *in_stack_00000128;
  double *in_stack_00000130;
  double *in_stack_00000138;
  double *in_stack_00000140;
  Model *in_stack_00000148;
  double *in_stack_00000160;
  double *in_stack_00000168;
  Vector *in_stack_00000170;
  Vector *in_stack_00000178;
  Vector *in_stack_00000180;
  Vector *in_stack_00000188;
  Vector *in_stack_00000190;
  Vector *in_stack_00000198;
  double in_stack_ffffffffffffff50;
  LpSolver *this_00;
  size_t in_stack_ffffffffffffff58;
  valarray<double> *in_stack_ffffffffffffff60;
  undefined4 local_2c;
  
  Model::rows((Model *)(in_RDI + 0x7a8));
  Model::cols((Model *)(in_RDI + 0x7a8));
  std::valarray<double>::resize
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::valarray<double>::resize
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::valarray<double>::resize
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::valarray<double>::resize
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::valarray<double>::resize
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::valarray<double>::resize
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  this_00 = in_stack_00000010;
  local_2c = Model::PresolveIPMStartingPoint
                       (in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                        in_stack_00000128,in_stack_00000120,in_stack_00000160,in_stack_00000168,
                        in_stack_00000170,in_stack_00000178,in_stack_00000180,in_stack_00000188,
                        in_stack_00000190,in_stack_00000198);
  if (local_2c == 0) {
    MakeIPMStartingPointValid(in_stack_00000010);
    local_2c = 0;
  }
  else {
    ClearIPMStartingPoint(this_00);
  }
  return local_2c;
}

Assistant:

Int LpSolver::LoadIPMStartingPoint(const double* x, const double* xl,
                                   const double* xu, const double* slack,
                                   const double* y, const double* zl,
                                   const double* zu) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    x_start_.resize(n+m);
    xl_start_.resize(n+m);
    xu_start_.resize(n+m);
    y_start_.resize(m);
    zl_start_.resize(n+m);
    zu_start_.resize(n+m);
    Int errflag = model_.PresolveIPMStartingPoint(x, xl, xu, slack, y, zl, zu,
                                                  x_start_, xl_start_,
                                                  xu_start_, y_start_,
                                                  zl_start_, zu_start_);
    if (errflag) {
        ClearIPMStartingPoint();
        return errflag;
    }
    MakeIPMStartingPointValid();
    return 0;
}